

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void maxHeapsort(HighsInt *heap_v,HighsInt *heap_i,HighsInt n)

{
  HighsInt HVar1;
  bool bVar2;
  HighsInt i;
  ulong uVar3;
  
  if (1 < n) {
    uVar3 = (ulong)(uint)n;
    do {
      HVar1 = heap_v[uVar3];
      heap_v[uVar3] = heap_v[1];
      heap_v[1] = HVar1;
      HVar1 = heap_i[uVar3];
      heap_i[uVar3] = heap_i[1];
      heap_i[1] = HVar1;
      maxHeapify(heap_v,heap_i,1,(HighsInt)(uVar3 - 1));
      bVar2 = 2 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void maxHeapsort(HighsInt* heap_v, HighsInt* heap_i, HighsInt n) {
  HighsInt temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}